

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O2

ptr<resp_msg> __thiscall nuraft::raft_server::handle_log_sync_req(raft_server *this,req_msg *req)

{
  pointer psVar1;
  long *plVar2;
  _func_int **pp_Var3;
  int iVar4;
  buffer *pbVar5;
  long lVar6;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  char *pcVar8;
  shared_ptr<nuraft::resp_msg> sVar9;
  undefined1 auVar10 [16];
  ptr<resp_msg> pVar11;
  string local_60;
  undefined4 local_40;
  int local_3c;
  undefined8 local_38;
  
  local_60._M_dataplus._M_p = (pointer)req[9].super_msg_base._vptr_msg_base[1];
  local_3c = 0xb;
  local_40 = *(undefined4 *)(in_RDX + 0x14);
  local_38 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
  sVar9 = std::make_shared<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int,unsigned_long>
                    ((unsigned_long *)this,(msg_type *)&local_60,&local_3c,(int *)&req->log_entries_
                     ,(unsigned_long *)&local_40);
  _Var7 = sVar9.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  psVar1 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (psVar1 != (pointer)0x0) {
    iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var7._M_pi = extraout_RDX;
    if (4 < iVar4) {
      psVar1 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pcVar8 = "false";
      if (((ulong)req[2].log_entries_.
                  super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) != 0) {
        pcVar8 = "true";
      }
      msg_if_given_abi_cxx11_
                (&local_60,"entries size %d, type %d, catching_up %s\n",
                 (ulong)(*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38)) >> 4,
                 (ulong)*(byte *)(**(long **)(in_RDX + 0x38) + 8),pcVar8);
      (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)(psVar1,5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                        ,"handle_log_sync_req",0x142,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      _Var7._M_pi = extraout_RDX_00;
    }
  }
  if ((*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38) == 0x10) &&
     (*(char *)(**(long **)(in_RDX + 0x38) + 8) == '\x04')) {
    if (((ulong)req[2].log_entries_.
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) != 0) {
      plVar2 = *(long **)&req[9].super_msg_base.type_;
      lVar6 = *(long *)(in_RDX + 0x28);
      pbVar5 = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
      (**(code **)(*plVar2 + 0x68))(plVar2,lVar6 + 1,pbVar5);
      psVar1 = req[9].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (psVar1 != (pointer)0x0) {
        iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr[1].buff_.
                          super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
        if (4 < iVar4) {
          psVar1 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          lVar6 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
          msg_if_given_abi_cxx11_(&local_60,"last log %lu",lVar6 + -1);
          (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"handle_log_sync_req",0x152,&local_60);
          std::__cxx11::string::~string((string *)&local_60);
        }
      }
      lVar6 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      LOCK();
      req[1].log_entries_.
      super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(lVar6 + -1);
      UNLOCK();
      lVar6 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      commit((raft_server *)req,lVar6 - 1);
      pp_Var3 = this->_vptr_raft_server;
      auVar10 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
      _Var7._M_pi = auVar10._8_8_;
      pp_Var3[4] = auVar10._0_8_;
      *(undefined1 *)(pp_Var3 + 6) = 1;
      goto LAB_00136c38;
    }
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar1 == (pointer)0x0) goto LAB_00136c38;
    iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var7._M_pi = extraout_RDX_03;
    if (iVar4 < 3) goto LAB_00136c38;
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              (&local_60,"This server is ready for cluster, ignore the request, my next log idx %lu"
               ,this->_vptr_raft_server[4]);
    (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar1,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
      ,"handle_log_sync_req",0x14d,&local_60);
  }
  else {
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar1 == (pointer)0x0) goto LAB_00136c38;
    iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)();
    _Var7._M_pi = extraout_RDX_01;
    if (iVar4 < 3) goto LAB_00136c38;
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              (&local_60,
               "receive an invalid LogSyncRequest as the log entry value doesn\'t meet the requirements: entries size %zu"
               ,*(long *)(in_RDX + 0x40) - *(long *)(in_RDX + 0x38) >> 4);
    (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar1,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
      ,"handle_log_sync_req",0x147,&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  _Var7._M_pi = extraout_RDX_02;
LAB_00136c38:
  pVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  pVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar11.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_log_sync_req(req_msg& req) {
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp
        ( cs_new<resp_msg>
          ( state_->get_term(), msg_type::sync_log_response, id_,
            req.get_src(), log_store_->next_slot() ) );

    p_db("entries size %d, type %d, catching_up %s\n",
         (int)entries.size(), (int)entries[0]->get_val_type(),
         (catching_up_)?"true":"false");
    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::log_pack ) {
        p_wn("receive an invalid LogSyncRequest as the log entry value "
             "doesn't meet the requirements: entries size %zu",
             entries.size() );
        return resp;
    }

    if (!catching_up_) {
        p_wn("This server is ready for cluster, ignore the request, "
             "my next log idx %" PRIu64 "", resp->get_next_idx());
        return resp;
    }

    log_store_->apply_pack(req.get_last_log_idx() + 1, entries[0]->get_buf());
    p_db("last log %" PRIu64, log_store_->next_slot() - 1);
    precommit_index_ = log_store_->next_slot() - 1;
    commit(log_store_->next_slot() - 1);
    resp->accept(log_store_->next_slot());
    return resp;
}